

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCxxModuleMapper.cxx
# Opt level: O3

bool __thiscall
CxxModuleUsage::AddReference(CxxModuleUsage *this,string *logical,string *loc,LookupMethod method)

{
  _Rb_tree_color _Var1;
  _Base_ptr __n;
  _Base_ptr p_Var2;
  int iVar3;
  iterator iVar4;
  mapped_type *pmVar5;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string local_100;
  basic_string_view<char,_std::char_traits<char>_> local_e0;
  size_type local_d0;
  pointer local_c8;
  undefined8 local_c0;
  char *local_b8;
  _Base_ptr local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  char *local_98;
  undefined8 local_90;
  char *local_88;
  undefined8 local_80;
  char *local_78;
  _Base_ptr local_70;
  pointer local_68;
  undefined8 local_60;
  char *local_58;
  undefined8 local_50;
  char *local_48;
  undefined8 local_40;
  char *local_38;
  
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleReference>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleReference>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleReference>_>_>
          ::find(&(this->Reference)._M_t,logical);
  if ((_Rb_tree_header *)iVar4._M_node == &(this->Reference)._M_t._M_impl.super__Rb_tree_header) {
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleReference,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleReference>_>_>
             ::operator[](&this->Reference,logical);
    std::__cxx11::string::_M_assign((string *)pmVar5);
    pmVar5->Method = method;
    return true;
  }
  __n = iVar4._M_node[2]._M_parent;
  p_Var2 = (_Base_ptr)loc->_M_string_length;
  if ((__n == p_Var2) &&
     (((__n == (_Base_ptr)0x0 ||
       (iVar3 = bcmp(*(void **)(iVar4._M_node + 2),(loc->_M_dataplus)._M_p,(size_t)__n), iVar3 == 0)
       ) && (iVar4._M_node[3]._M_color == method)))) {
    return true;
  }
  local_c8 = (logical->_M_dataplus)._M_p;
  local_d0 = logical->_M_string_length;
  _Var1 = iVar4._M_node[3]._M_color;
  local_48 = "by-name";
  local_50 = 7;
  local_90 = 7;
  local_88 = "by-name";
  if (_Var1 != _S_red) {
    if (_Var1 == 2) {
      local_88 = "include-quote";
    }
    else {
      if (_Var1 != _S_black) goto LAB_00449038;
      local_88 = "include-angle";
    }
    local_90 = 0xd;
  }
  if (method != ByName) {
    if (method == IncludeQuote) {
      local_48 = "include-quote";
    }
    else {
      if (method != IncludeAngle) {
LAB_00449038:
        __assert_fail("false && \"unsupported lookup method\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCxxModuleMapper.cxx"
                      ,0x9b,
                      "auto CxxModuleUsage::AddReference(const std::string &, const std::string &, LookupMethod)::(anonymous class)::operator()(LookupMethod) const"
                     );
      }
      local_48 = "include-angle";
    }
    local_50 = 0xd;
  }
  local_e0._M_len = 0x25;
  local_e0._M_str = "Disagreement of the location of the \'";
  local_c0 = 0x17;
  local_b8 = "\' module. Location A: \'";
  local_a8 = *(undefined8 *)(iVar4._M_node + 2);
  local_a0 = 6;
  local_98 = "\' via ";
  local_80 = 0xf;
  local_78 = "; Location B: \'";
  local_68 = (loc->_M_dataplus)._M_p;
  local_60 = 6;
  local_58 = "\' via ";
  local_40 = 1;
  local_38 = ".";
  views._M_len = 0xb;
  views._M_array = &local_e0;
  local_b0 = __n;
  local_70 = p_Var2;
  cmCatViews_abi_cxx11_(&local_100,views);
  cmSystemTools::Error(&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  return false;
}

Assistant:

bool CxxModuleUsage::AddReference(std::string const& logical,
                                  std::string const& loc, LookupMethod method)
{
  auto r = this->Reference.find(logical);
  if (r != this->Reference.end()) {
    auto& ref = r->second;

    if (ref.Path == loc && ref.Method == method) {
      return true;
    }

    auto method_name = [](LookupMethod m) -> cm::static_string_view {
      switch (m) {
        case LookupMethod::ByName:
          return "by-name"_s;
        case LookupMethod::IncludeAngle:
          return "include-angle"_s;
        case LookupMethod::IncludeQuote:
          return "include-quote"_s;
      }
      assert(false && "unsupported lookup method");
      return ""_s;
    };

    cmSystemTools::Error(cmStrCat("Disagreement of the location of the '",
                                  logical,
                                  "' module. "
                                  "Location A: '",
                                  ref.Path, "' via ", method_name(ref.Method),
                                  "; "
                                  "Location B: '",
                                  loc, "' via ", method_name(method), "."));
    return false;
  }

  auto& ref = this->Reference[logical];
  ref.Path = loc;
  ref.Method = method;

  return true;
}